

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS ref_inflate_sort_rail(REF_INT n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  REF_INT *sorted_index;
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *tmp;
  REF_INT *order;
  REF_INT node;
  REF_DBL *phi_local;
  REF_DBL *yz_local;
  REF_DBL *x_local;
  REF_INT n_local;
  
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x1b3
           ,"ref_inflate_sort_rail","malloc order of REF_INT negative");
    x_local._4_4_ = 1;
  }
  else {
    sorted_index = (REF_INT *)malloc((long)n << 2);
    if (sorted_index == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x1b3,"ref_inflate_sort_rail","malloc order of REF_INT NULL");
      x_local._4_4_ = 2;
    }
    else if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x1b4,"ref_inflate_sort_rail","malloc tmp of REF_DBL negative");
      x_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)n << 3);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x1b4,"ref_inflate_sort_rail","malloc tmp of REF_DBL NULL");
        x_local._4_4_ = 2;
      }
      else {
        x_local._4_4_ = ref_sort_heap_dbl(n,x,sorted_index);
        if (x_local._4_4_ == 0) {
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8) = x[sorted_index[order._4_4_]];
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            x[order._4_4_] = *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8);
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8) = yz[sorted_index[order._4_4_] << 1];
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            yz[order._4_4_ << 1] = *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8);
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8) =
                 yz[sorted_index[order._4_4_] * 2 + 1];
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            yz[order._4_4_ * 2 + 1] = *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8);
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8) = phi[sorted_index[order._4_4_]];
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            phi[order._4_4_] = *(REF_DBL *)((long)__ptr + (long)order._4_4_ * 8);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          if (sorted_index != (REF_INT *)0x0) {
            free(sorted_index);
          }
          x_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x1b5,"ref_inflate_sort_rail",(ulong)x_local._4_4_,"heap");
        }
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_sort_rail(REF_INT n, REF_DBL *x,
                                                REF_DBL *yz, REF_DBL *phi) {
  REF_INT node;
  REF_INT *order;
  REF_DBL *tmp;
  ref_malloc(order, n, REF_INT);
  ref_malloc(tmp, n, REF_DBL);
  RSS(ref_sort_heap_dbl(n, x, order), "heap");
  for (node = 0; node < n; node++) {
    tmp[node] = x[order[node]];
  }
  for (node = 0; node < n; node++) {
    x[node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = yz[0 + 2 * order[node]];
  }
  for (node = 0; node < n; node++) {
    yz[0 + 2 * node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = yz[1 + 2 * order[node]];
  }
  for (node = 0; node < n; node++) {
    yz[1 + 2 * node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = phi[order[node]];
  }
  for (node = 0; node < n; node++) {
    phi[node] = tmp[node];
  }
  ref_free(tmp);
  ref_free(order);
  return REF_SUCCESS;
}